

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomimp.cpp
# Opt level: O2

int AF_A_TroopAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  DAngle angle;
  bool bVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  PClassActor *type;
  AActor *self;
  char *__assertion;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  FName local_28;
  FSoundID local_24;
  undefined8 local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0051f899;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_0051f716:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0051f899;
        }
      }
      if (numparam == 1) goto LAB_0051f796;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0051f889;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0051f899;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0051f889;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0051f796:
        obj = &self->target;
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar5 != (AActor *)0x0) {
          A_FaceTarget(self);
          bVar2 = AActor::CheckMeleeRange(self);
          if (bVar2) {
            iVar3 = FRandom::operator()(&pr_troopattack);
            iVar3 = (iVar3 % 8) * 3 + 3;
            local_24.ID = S_FindSound("imp/melee");
            S_Sound(self,1,&local_24,1.0,1.0);
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            local_28.Index = 0x84;
            local_20 = 0;
            angle.Degrees._4_4_ = extraout_XMM0_Db;
            angle.Degrees._0_4_ = extraout_XMM0_Da;
            iVar4 = P_DamageMobj(pAVar5,self,self,iVar3,&local_28,0,angle);
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            P_TraceBleed(iVar3,pAVar5,self);
          }
          else {
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            type = PClass::FindActor("DoomImpBall");
            P_SpawnMissile(self,pAVar5,type,(AActor *)0x0);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0051f899;
    }
    if (self == (AActor *)0x0) goto LAB_0051f716;
  }
LAB_0051f889:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0051f899:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TroopAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = (pr_troopattack()%8+1)*3;
		S_Sound (self, CHAN_WEAPON, "imp/melee", 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		return 0;
	}
	
	// launch a missile
	P_SpawnMissile (self, self->target, PClass::FindActor("DoomImpBall"));
	return 0;
}